

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O2

void __thiscall
ImageTypeManager::setFunctionTable
          (ImageTypeManager *this,uint8_t type,FunctionTableHolder *table,bool forceSetup)

{
  iterator iVar1;
  mapped_type *__dest;
  uint8_t local_19;
  
  local_19 = type;
  iVar1 = std::
          _Rb_tree<unsigned_char,_std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>,_std::_Select1st<std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>_>_>
          ::find((_Rb_tree<unsigned_char,_std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>,_std::_Select1st<std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>_>_>
                  *)this,&local_19);
  if ((_Rb_tree_header *)iVar1._M_node ==
      &(this->_functionTableMap)._M_t._M_impl.super__Rb_tree_header) {
    __dest = std::
             map<unsigned_char,_Image_Function_Helper::FunctionTableHolder,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>_>_>
             ::operator[](&this->_functionTableMap,&local_19);
    memcpy(__dest,table,0x108);
  }
  else {
    if ((_Base_ptr)table->AbsoluteDifference != (_Base_ptr)0x0 && forceSetup ||
        iVar1._M_node[1]._M_parent == (_Base_ptr)0x0) {
      iVar1._M_node[1]._M_parent = (_Base_ptr)table->AbsoluteDifference;
    }
    if ((_Base_ptr)table->Accumulate != (_Base_ptr)0x0 && forceSetup ||
        iVar1._M_node[1]._M_left == (_Base_ptr)0x0) {
      iVar1._M_node[1]._M_left = (_Base_ptr)table->Accumulate;
    }
    if ((_Base_ptr)table->BitwiseAnd != (_Base_ptr)0x0 && forceSetup ||
        iVar1._M_node[1]._M_right == (_Base_ptr)0x0) {
      iVar1._M_node[1]._M_right = (_Base_ptr)table->BitwiseAnd;
    }
    if (table->BitwiseOr != (BitwiseOrForm4)0x0 && forceSetup || *(long *)(iVar1._M_node + 2) == 0)
    {
      *(BitwiseOrForm4 *)(iVar1._M_node + 2) = table->BitwiseOr;
    }
    if ((_Base_ptr)table->BitwiseXor != (_Base_ptr)0x0 && forceSetup ||
        iVar1._M_node[2]._M_parent == (_Base_ptr)0x0) {
      iVar1._M_node[2]._M_parent = (_Base_ptr)table->BitwiseXor;
    }
    if ((_Base_ptr)table->ConvertToGrayScale != (_Base_ptr)0x0 && forceSetup ||
        iVar1._M_node[2]._M_left == (_Base_ptr)0x0) {
      iVar1._M_node[2]._M_left = (_Base_ptr)table->ConvertToGrayScale;
    }
    if ((_Base_ptr)table->ConvertToRgb != (_Base_ptr)0x0 && forceSetup ||
        iVar1._M_node[2]._M_right == (_Base_ptr)0x0) {
      iVar1._M_node[2]._M_right = (_Base_ptr)table->ConvertToRgb;
    }
    if (table->Copy != (CopyForm3)0x0 && forceSetup || *(long *)(iVar1._M_node + 3) == 0) {
      *(CopyForm3 *)(iVar1._M_node + 3) = table->Copy;
    }
    if ((_Base_ptr)table->ExtractChannel != (_Base_ptr)0x0 && forceSetup ||
        iVar1._M_node[3]._M_parent == (_Base_ptr)0x0) {
      iVar1._M_node[3]._M_parent = (_Base_ptr)table->ExtractChannel;
    }
    if ((_Base_ptr)table->Fill != (_Base_ptr)0x0 && forceSetup ||
        iVar1._M_node[3]._M_left == (_Base_ptr)0x0) {
      iVar1._M_node[3]._M_left = (_Base_ptr)table->Fill;
    }
    if ((_Base_ptr)table->Flip != (_Base_ptr)0x0 && forceSetup ||
        iVar1._M_node[3]._M_right == (_Base_ptr)0x0) {
      iVar1._M_node[3]._M_right = (_Base_ptr)table->Flip;
    }
    if (table->GammaCorrection != (GammaCorrectionForm4)0x0 && forceSetup ||
        *(long *)(iVar1._M_node + 4) == 0) {
      *(GammaCorrectionForm4 *)(iVar1._M_node + 4) = table->GammaCorrection;
    }
    if ((_Base_ptr)table->GetPixel != (_Base_ptr)0x0 && forceSetup ||
        iVar1._M_node[4]._M_parent == (_Base_ptr)0x0) {
      iVar1._M_node[4]._M_parent = (_Base_ptr)table->GetPixel;
    }
    if ((_Base_ptr)table->Histogram != (_Base_ptr)0x0 && forceSetup ||
        iVar1._M_node[4]._M_left == (_Base_ptr)0x0) {
      iVar1._M_node[4]._M_left = (_Base_ptr)table->Histogram;
    }
    if ((_Base_ptr)table->Invert != (_Base_ptr)0x0 && forceSetup ||
        iVar1._M_node[4]._M_right == (_Base_ptr)0x0) {
      iVar1._M_node[4]._M_right = (_Base_ptr)table->Invert;
    }
    if (table->IsEqual != (IsEqualForm2)0x0 && forceSetup || *(long *)(iVar1._M_node + 5) == 0) {
      *(IsEqualForm2 *)(iVar1._M_node + 5) = table->IsEqual;
    }
    if ((_Base_ptr)table->LookupTable != (_Base_ptr)0x0 && forceSetup ||
        iVar1._M_node[5]._M_parent == (_Base_ptr)0x0) {
      iVar1._M_node[5]._M_parent = (_Base_ptr)table->LookupTable;
    }
    if ((_Base_ptr)table->Maximum != (_Base_ptr)0x0 && forceSetup ||
        iVar1._M_node[5]._M_left == (_Base_ptr)0x0) {
      iVar1._M_node[5]._M_left = (_Base_ptr)table->Maximum;
    }
    if ((_Base_ptr)table->Merge != (_Base_ptr)0x0 && forceSetup ||
        iVar1._M_node[5]._M_right == (_Base_ptr)0x0) {
      iVar1._M_node[5]._M_right = (_Base_ptr)table->Merge;
    }
    if (table->Minimum != (MinimumForm4)0x0 && forceSetup || *(long *)(iVar1._M_node + 6) == 0) {
      *(MinimumForm4 *)(iVar1._M_node + 6) = table->Minimum;
    }
    if ((_Base_ptr)table->Normalize != (_Base_ptr)0x0 && forceSetup ||
        iVar1._M_node[6]._M_parent == (_Base_ptr)0x0) {
      iVar1._M_node[6]._M_parent = (_Base_ptr)table->Normalize;
    }
    if ((_Base_ptr)table->ProjectionProfile != (_Base_ptr)0x0 && forceSetup ||
        iVar1._M_node[6]._M_left == (_Base_ptr)0x0) {
      iVar1._M_node[6]._M_left = (_Base_ptr)table->ProjectionProfile;
    }
    if ((_Base_ptr)table->Resize != (_Base_ptr)0x0 && forceSetup ||
        iVar1._M_node[6]._M_right == (_Base_ptr)0x0) {
      iVar1._M_node[6]._M_right = (_Base_ptr)table->Resize;
    }
    if (table->RgbToBgr != (RgbToBgrForm4)0x0 && forceSetup || *(long *)(iVar1._M_node + 7) == 0) {
      *(RgbToBgrForm4 *)(iVar1._M_node + 7) = table->RgbToBgr;
    }
    if ((_Base_ptr)table->SetPixel != (_Base_ptr)0x0 && forceSetup ||
        iVar1._M_node[7]._M_parent == (_Base_ptr)0x0) {
      iVar1._M_node[7]._M_parent = (_Base_ptr)table->SetPixel;
    }
    if ((_Base_ptr)table->SetPixel2 != (_Base_ptr)0x0 && forceSetup ||
        iVar1._M_node[7]._M_left == (_Base_ptr)0x0) {
      iVar1._M_node[7]._M_left = (_Base_ptr)table->SetPixel2;
    }
    if (table->Split != (SplitForm2)0x0 && forceSetup || *(long *)(iVar1._M_node + 8) == 0) {
      *(SplitForm2 *)(iVar1._M_node + 8) = table->Split;
    }
    if ((_Base_ptr)table->Subtract != (_Base_ptr)0x0 && forceSetup ||
        iVar1._M_node[8]._M_parent == (_Base_ptr)0x0) {
      iVar1._M_node[8]._M_parent = (_Base_ptr)table->Subtract;
    }
    if ((_Base_ptr)table->Sum != (_Base_ptr)0x0 && forceSetup ||
        iVar1._M_node[8]._M_left == (_Base_ptr)0x0) {
      iVar1._M_node[8]._M_left = (_Base_ptr)table->Sum;
    }
    if ((_Base_ptr)table->Threshold != (_Base_ptr)0x0 && forceSetup ||
        iVar1._M_node[8]._M_right == (_Base_ptr)0x0) {
      iVar1._M_node[8]._M_right = (_Base_ptr)table->Threshold;
    }
    if (table->Threshold2 != (ThresholdDoubleForm4)0x0 && forceSetup ||
        *(long *)(iVar1._M_node + 9) == 0) {
      *(ThresholdDoubleForm4 *)(iVar1._M_node + 9) = table->Threshold2;
    }
    if (forceSetup && (_Base_ptr)table->Transpose != (_Base_ptr)0x0 ||
        iVar1._M_node[9]._M_parent == (_Base_ptr)0x0) {
      iVar1._M_node[9]._M_parent = (_Base_ptr)table->Transpose;
    }
  }
  return;
}

Assistant:

void ImageTypeManager::setFunctionTable( uint8_t type, const Image_Function_Helper::FunctionTableHolder & table, bool forceSetup )
{
    std::map< uint8_t, Image_Function_Helper::FunctionTableHolder >::iterator oldTable = _functionTableMap.find( type );
    if ( oldTable != _functionTableMap.end() )
        setupTable( oldTable->second, table, forceSetup );
    else
        _functionTableMap[type] = table;
}